

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fTextureSpecificationTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::TexSubImage2DAlignCase::TexSubImage2DAlignCase
          (TexSubImage2DAlignCase *this,Context *context,char *name,char *desc,
          deUint32 internalFormat,int width,int height,int subX,int subY,int subW,int subH,
          int alignment)

{
  TransferFormat TVar1;
  TextureFormat local_38;
  
  local_38 = glu::mapGLInternalFormat(internalFormat);
  Texture2DSpecCase::Texture2DSpecCase
            (&this->super_Texture2DSpecCase,context,name,desc,&local_38,width,height,1);
  (this->super_Texture2DSpecCase).super_TextureSpecCase.super_TestCase.super_TestCase.super_TestNode
  ._vptr_TestNode = (_func_int **)&PTR__Texture3DSpecCase_00d251a0;
  *(deUint32 *)&(this->super_Texture2DSpecCase).field_0xd4 = internalFormat;
  this->m_format = 0;
  this->m_dataType = 0;
  this->m_subX = subX;
  this->m_subY = subY;
  this->m_subW = subW;
  this->m_subH = subH;
  this->m_alignment = alignment;
  TVar1 = glu::getTransferFormat((this->super_Texture2DSpecCase).m_texFormat);
  this->m_format = TVar1.format;
  this->m_dataType = TVar1.dataType;
  return;
}

Assistant:

TexSubImage2DAlignCase (Context& context, const char* name, const char* desc, deUint32 internalFormat, int width, int height, int subX, int subY, int subW, int subH, int alignment)
		: Texture2DSpecCase	(context, name, desc, glu::mapGLInternalFormat(internalFormat), width, height, 1)
		, m_internalFormat	(internalFormat)
		, m_format			(GL_NONE)
		, m_dataType		(GL_NONE)
		, m_subX			(subX)
		, m_subY			(subY)
		, m_subW			(subW)
		, m_subH			(subH)
		, m_alignment		(alignment)
	{
		glu::TransferFormat fmt = glu::getTransferFormat(m_texFormat);
		m_format	= fmt.format;
		m_dataType	= fmt.dataType;
	}